

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O0

bdecode_node * __thiscall
libtorrent::bdecode(bdecode_node *__return_storage_ptr__,libtorrent *this,span<const_char> buffer,
                   int depth_limit,int token_limit)

{
  error_code ec_00;
  bool bVar1;
  system_error *this_00;
  span<const_char> buffer_00;
  int in_stack_ffffffffffffff70;
  libtorrent *local_50;
  char *local_48;
  undefined1 local_39;
  undefined1 auStack_38 [8];
  error_code ec;
  int token_limit_local;
  int depth_limit_local;
  span<const_char> buffer_local;
  bdecode_node *ret;
  
  buffer_local.m_ptr = buffer.m_ptr;
  ec.cat_._4_4_ = (uint)buffer.m_len;
  ec.cat_._0_4_ = depth_limit;
  _token_limit_local = this;
  buffer_local.m_len = (difference_type)__return_storage_ptr__;
  boost::system::error_code::error_code((error_code *)auStack_38);
  local_39 = 0;
  span<char_const>::span<libtorrent::span<char_const>,char_const,void>
            ((span<char_const> *)&local_50,(span<const_char> *)&token_limit_local);
  buffer_00.m_len = (difference_type)auStack_38;
  buffer_00.m_ptr = local_48;
  bdecode(__return_storage_ptr__,local_50,buffer_00,(error_code *)0x0,(int *)(ulong)ec.cat_._4_4_,
          (int)ec.cat_,in_stack_ffffffffffffff70);
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)auStack_38);
  if (bVar1) {
    this_00 = (system_error *)__cxa_allocate_exception(0x40);
    ec_00.cat_ = (error_category *)ec._0_8_;
    ec_00.val_ = auStack_38._0_4_;
    ec_00.failed_ = (bool)auStack_38[4];
    ec_00._5_3_ = auStack_38._5_3_;
    boost::system::system_error::system_error(this_00,ec_00);
    __cxa_throw(this_00,&boost::system::system_error::typeinfo,
                boost::system::system_error::~system_error);
  }
  return __return_storage_ptr__;
}

Assistant:

bdecode_node bdecode(span<char const> buffer, int depth_limit, int token_limit)
	{
		error_code ec;
		bdecode_node ret = bdecode(buffer, ec, nullptr, depth_limit, token_limit);
		if (ec) throw system_error(ec);
		return ret;
	}